

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

bool equilibrationScaleMatrix(HighsOptions *options,HighsLp *lp,HighsInt use_scale_strategy)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer piVar8;
  pointer pdVar9;
  pointer pdVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  char *format;
  HighsInt iRow;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  HighsLogType type;
  size_type __n;
  HighsLogOptions *pHVar17;
  bool bVar18;
  double dVar19;
  double dVar20;
  undefined1 *puVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 *puVar25;
  double dVar26;
  double dVar27;
  undefined1 *puVar28;
  undefined1 *puVar29;
  double dVar30;
  undefined1 *puVar31;
  undefined1 *puVar32;
  double dVar33;
  double local_178;
  double local_168;
  double local_160;
  double local_150;
  double local_148;
  double local_140;
  allocator_type local_119;
  double local_118;
  double local_110;
  undefined1 *local_108;
  double local_100;
  undefined1 *local_f8;
  double local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  double local_c8;
  double finite_infinity;
  HighsInt local_b4;
  vector<double,_std::allocator<double>_> row_max_value;
  vector<double,_std::allocator<double>_> row_min_value;
  vector<double,_std::allocator<double>_> original_row_min_value;
  vector<double,_std::allocator<double>_> original_row_max_value;
  undefined1 *local_38;
  
  uVar1 = lp->num_col_;
  uVar2 = lp->num_row_;
  __n = (size_type)(int)uVar2;
  uVar3 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)uVar1];
  uVar11 = 0;
  uVar12 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar12 = uVar11;
  }
  dVar27 = 0.0;
  dVar30 = INFINITY;
  for (; uVar12 != uVar11; uVar11 = uVar11 + 1) {
    dVar19 = ABS((lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11]);
    dVar20 = dVar19;
    if (dVar30 <= dVar19) {
      dVar20 = dVar30;
    }
    if (dVar19 <= dVar27) {
      dVar19 = dVar27;
    }
    dVar27 = dVar19;
    dVar30 = dVar20;
  }
  uVar12 = 0;
  uVar11 = 0;
  if (0 < (int)uVar1) {
    uVar11 = (ulong)uVar1;
  }
  local_168 = INFINITY;
  for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
    dVar19 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12];
    if (((dVar19 != 0.0) || (NAN(dVar19))) && (ABS(dVar19) <= local_168)) {
      local_168 = ABS(dVar19);
    }
  }
  finite_infinity = 1e+200;
  local_b4 = use_scale_strategy;
  dVar19 = ldexp(1.0,(options->super_HighsOptionsStruct).allowed_matrix_scale_factor);
  std::vector<double,_std::allocator<double>_>::vector
            (&row_min_value,__n,&finite_infinity,(allocator_type *)&row_max_value);
  original_row_min_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_16687e92154ef7ac;
  std::vector<double,_std::allocator<double>_>::vector
            (&row_max_value,__n,(value_type_conflict1 *)&original_row_min_value,
             (allocator_type *)&original_row_max_value);
  dVar20 = 1.0 / dVar19;
  uVar12 = 0;
  iVar16 = 0;
  if (0 < (int)uVar2) {
    uVar12 = (ulong)uVar2;
    iVar16 = 0;
  }
  for (; iVar16 != 6; iVar16 = iVar16 + 1) {
    uVar15 = 0;
    while (uVar14 = uVar15, uVar14 != uVar11) {
      puVar21 = &DAT_16687e92154ef7ac;
      puVar25 = (undefined1 *)0x6974e718d7d7625a;
      if (local_168 < 0.1) {
        dVar22 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar14];
        puVar21 = &DAT_16687e92154ef7ac;
        puVar25 = (undefined1 *)0x6974e718d7d7625a;
        if ((dVar22 != 0.0) || (NAN(dVar22))) {
          puVar21 = (undefined1 *)ABS(dVar22);
          puVar25 = puVar21;
          if (1e+200 <= (double)puVar21) {
            puVar25 = (undefined1 *)0x6974e718d7d7625a;
          }
          if ((double)puVar21 <= 1e-200) {
            puVar21 = &DAT_16687e92154ef7ac;
          }
        }
      }
      piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar13 = (long)piVar6[uVar14]; lVar13 < piVar6[uVar14 + 1]; lVar13 = lVar13 + 1) {
        puVar28 = (undefined1 *)
                  (ABS((lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar13]) *
                  (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [(lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar13]]);
        puVar32 = puVar28;
        if ((double)puVar25 <= (double)puVar28) {
          puVar32 = puVar25;
        }
        puVar25 = puVar32;
        if ((double)puVar28 <= (double)puVar21) {
          puVar28 = puVar21;
        }
        puVar21 = puVar28;
      }
      dVar22 = (double)puVar21 * (double)puVar25;
      if (dVar22 < 0.0) {
        dVar22 = sqrt(dVar22);
      }
      else {
        dVar22 = SQRT(dVar22);
      }
      dVar23 = 1.0 / dVar22;
      if (1.0 / dVar22 <= dVar20) {
        dVar23 = dVar20;
      }
      dVar22 = dVar19;
      if (dVar23 <= dVar19) {
        dVar22 = dVar23;
      }
      pdVar7 = (lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7[uVar14] = dVar22;
      piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar4 = piVar6[uVar14 + 1];
      pdVar9 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar13 = (long)piVar6[uVar14]; uVar15 = uVar14 + 1, lVar13 < iVar4; lVar13 = lVar13 + 1)
      {
        iVar5 = piVar8[lVar13];
        dVar22 = ABS(pdVar9[lVar13]) * pdVar7[uVar14];
        dVar23 = dVar22;
        if (row_min_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar5] <= dVar22) {
          dVar23 = row_min_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar5];
        }
        row_min_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar5] = dVar23;
        if (dVar22 <= row_max_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar5]) {
          dVar22 = row_max_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar5];
        }
        row_max_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar5] = dVar22;
      }
    }
    for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
      dVar22 = row_min_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar15] *
               row_max_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar15];
      if (dVar22 < 0.0) {
        dVar22 = sqrt(dVar22);
      }
      else {
        dVar22 = SQRT(dVar22);
      }
      dVar23 = 1.0 / dVar22;
      if (1.0 / dVar22 <= dVar20) {
        dVar23 = dVar20;
      }
      dVar22 = dVar19;
      if (dVar23 <= dVar19) {
        dVar22 = dVar23;
      }
      (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar15] = dVar22;
    }
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&row_min_value,__n,&finite_infinity);
    original_row_min_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&DAT_16687e92154ef7ac;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&row_max_value,__n,(value_type_conflict1 *)&original_row_min_value);
  }
  local_d8 = (undefined1 *)0x6974e718d7d7625a;
  local_d0 = &DAT_16687e92154ef7ac;
  for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
    dVar19 = log((lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar15]);
    dVar19 = floor(dVar19 / 0.6931471805599453 + 0.5);
    puVar25 = (undefined1 *)exp2(dVar19);
    (lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar15] = (double)puVar25;
    if ((double)puVar25 <= (double)local_d8) {
      local_d8 = puVar25;
    }
    if ((double)local_d0 <= (double)puVar25) {
      local_d0 = puVar25;
    }
  }
  local_e8 = (undefined1 *)0x6974e718d7d7625a;
  local_e0 = &DAT_16687e92154ef7ac;
  for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
    dVar19 = log((lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar15]);
    dVar19 = floor(dVar19 / 0.6931471805599453 + 0.5);
    puVar25 = (undefined1 *)exp2(dVar19);
    (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar15] = (double)puVar25;
    if ((double)puVar25 <= (double)local_e8) {
      local_e8 = puVar25;
    }
    if ((double)local_e0 <= (double)puVar25) {
      local_e0 = puVar25;
    }
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&original_row_min_value,__n,&finite_infinity,(allocator_type *)&original_row_max_value)
  ;
  local_38 = &DAT_16687e92154ef7ac;
  std::vector<double,_std::allocator<double>_>::vector
            (&original_row_max_value,__n,(value_type_conflict1 *)&local_38,&local_119);
  std::vector<double,_std::allocator<double>_>::_M_fill_assign(&row_min_value,__n,&finite_infinity);
  local_38 = &DAT_16687e92154ef7ac;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&row_max_value,__n,(value_type_conflict1 *)&local_38);
  local_100 = 1e+200;
  local_c8 = 0.0;
  local_168 = 0.0;
  local_110 = 1e+200;
  local_108 = (undefined1 *)0x0;
  local_f8 = (undefined1 *)0x6974e718d7d7625a;
  local_140 = 0.0;
  local_148 = 0.0;
  uVar15 = 0;
  puVar25 = local_108;
  while (local_108 = puVar25, uVar15 != uVar11) {
    piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = uVar15 + 1;
    iVar16 = piVar6[uVar15 + 1];
    pdVar7 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar21 = (undefined1 *)0x6974e718d7d7625a;
    puVar28 = &DAT_16687e92154ef7ac;
    puVar32 = (undefined1 *)0x6974e718d7d7625a;
    puVar25 = &DAT_16687e92154ef7ac;
    for (lVar13 = (long)piVar6[uVar15]; lVar13 < iVar16; lVar13 = lVar13 + 1) {
      iVar4 = piVar8[lVar13];
      puVar29 = (undefined1 *)ABS(pdVar7[lVar13]);
      if ((double)puVar29 <= (double)puVar21) {
        puVar21 = puVar29;
      }
      if ((double)puVar28 <= (double)puVar29) {
        puVar28 = puVar29;
      }
      puVar31 = puVar29;
      if (original_row_min_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar4] <= (double)puVar29) {
        puVar31 = (undefined1 *)
                  original_row_min_value.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[iVar4];
      }
      original_row_min_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar4] = (double)puVar31;
      if ((double)puVar29 <=
          original_row_max_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar4]) {
        puVar29 = (undefined1 *)
                  original_row_max_value.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[iVar4];
      }
      original_row_max_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar4] = (double)puVar29;
      dVar19 = pdVar9[uVar15] * pdVar10[iVar4] * pdVar7[lVar13];
      pdVar7[lVar13] = dVar19;
      puVar29 = (undefined1 *)ABS(dVar19);
      if ((double)puVar29 <= (double)puVar32) {
        puVar32 = puVar29;
      }
      if ((double)puVar25 <= (double)puVar29) {
        puVar25 = puVar29;
      }
      puVar31 = puVar29;
      if (row_min_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar4] <= (double)puVar29) {
        puVar31 = (undefined1 *)
                  row_min_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar4];
      }
      row_min_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar4] = (double)puVar31;
      if ((double)puVar29 <=
          row_max_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar4]) {
        puVar29 = (undefined1 *)
                  row_max_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar4];
      }
      row_max_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar4] = (double)puVar29;
    }
    dVar19 = (double)puVar21 * (double)puVar28;
    if (dVar19 < 0.0) {
      dVar19 = sqrt(dVar19);
    }
    else {
      dVar19 = SQRT(dVar19);
    }
    dVar19 = 1.0 / dVar19;
    dVar20 = log(dVar19);
    dVar22 = (double)puVar32 * (double)puVar25;
    if (dVar22 < 0.0) {
      local_118 = dVar20;
      dVar22 = sqrt(dVar22);
      dVar20 = local_118;
    }
    else {
      dVar22 = SQRT(dVar22);
    }
    if ((double)local_f8 <= (double)puVar32) {
      puVar32 = local_f8;
    }
    if ((double)puVar25 <= (double)local_108) {
      puVar25 = local_108;
    }
    if (dVar19 <= local_110) {
      local_110 = dVar19;
    }
    local_148 = local_148 + dVar20;
    if (local_168 <= dVar19) {
      local_168 = dVar19;
    }
    local_108 = (undefined1 *)(1.0 / dVar22);
    if ((double)local_108 <= local_100) {
      local_100 = (double)local_108;
    }
    dVar19 = log((double)local_108);
    local_140 = local_140 + dVar19;
    uVar15 = uVar14;
    local_f8 = puVar32;
    if (local_c8 <= (double)local_108) {
      local_c8 = (double)local_108;
    }
  }
  local_178 = 0.0;
  dVar19 = 0.0;
  local_118 = 1e+200;
  local_150 = 1e+200;
  dVar20 = 0.0;
  local_160 = 0.0;
  for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
    dVar22 = original_row_min_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar15] *
             original_row_max_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar15];
    if (dVar22 < 0.0) {
      dVar22 = sqrt(dVar22);
    }
    else {
      dVar22 = SQRT(dVar22);
    }
    dVar22 = 1.0 / dVar22;
    dVar23 = log(dVar22);
    dVar24 = row_min_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar15] *
             row_max_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar15];
    if (dVar24 < 0.0) {
      local_f0 = dVar23;
      dVar24 = sqrt(dVar24);
      dVar23 = local_f0;
    }
    else {
      dVar24 = SQRT(dVar24);
    }
    if (dVar22 <= local_150) {
      local_150 = dVar22;
    }
    local_160 = local_160 + dVar23;
    if (local_178 <= dVar22) {
      local_178 = dVar22;
    }
    dVar24 = 1.0 / dVar24;
    if (dVar24 <= local_118) {
      local_118 = dVar24;
    }
    dVar22 = log(dVar24);
    dVar20 = dVar20 + dVar22;
    if (dVar19 <= dVar24) {
      dVar19 = dVar24;
    }
  }
  dVar22 = exp(local_148 / (double)(int)uVar1);
  dVar23 = exp(local_160 / (double)(int)uVar2);
  dVar24 = exp(local_140 / (double)(int)uVar1);
  dVar20 = exp(dVar20 / (double)(int)uVar2);
  if ((options->super_HighsOptionsStruct).log_dev_level != 0) {
    pHVar17 = &(options->super_HighsOptionsStruct).log_options;
    highsLogDev(pHVar17,kInfo,
                "Scaling: Original equilibration: min/mean/max %11.4g/%11.4g/%11.4g (cols); min/mean/max %11.4g/%11.4g/%11.4g (rows)\n"
                ,local_110,dVar22,local_168,local_150,dVar23,local_178);
    highsLogDev(pHVar17,kInfo,
                "Scaling: Final    equilibration: min/mean/max %11.4g/%11.4g/%11.4g (cols); min/mean/max %11.4g/%11.4g/%11.4g (rows)\n"
                ,local_100,dVar24,local_c8,local_118,dVar20,dVar19);
  }
  dVar26 = 1.0 / dVar22;
  if (1.0 / dVar22 <= dVar22) {
    dVar26 = dVar22;
  }
  dVar22 = 1.0 / dVar23;
  if (1.0 / dVar23 <= dVar23) {
    dVar22 = dVar23;
  }
  dVar23 = 1.0 / dVar24;
  if (1.0 / dVar24 <= dVar24) {
    dVar23 = dVar24;
  }
  dVar24 = 1.0 / dVar20;
  if (1.0 / dVar20 <= dVar20) {
    dVar24 = dVar20;
  }
  local_f0 = dVar23 * dVar24;
  dVar20 = (dVar26 * dVar22) / local_f0;
  if (dVar20 < 0.0) {
    dVar20 = sqrt(dVar20);
  }
  else {
    dVar20 = SQRT(dVar20);
  }
  dVar19 = (local_168 / local_110 + local_178 / local_150) /
           (local_c8 / local_100 + dVar19 / local_118);
  local_110 = (double)local_108 / (double)local_f8;
  dVar33 = (dVar27 / dVar30) / local_110;
  if ((options->super_HighsOptionsStruct).log_dev_level != 0) {
    pHVar17 = &(options->super_HighsOptionsStruct).log_options;
    highsLogDev(pHVar17,kInfo,
                "Scaling: Extreme equilibration improvement =      ( %11.4g + %11.4g) / ( %11.4g + %11.4g)  =      %11.4g / %11.4g  = %11.4g\n"
               );
    highsLogDev(pHVar17,kInfo,
                "Scaling: Mean    equilibration improvement = sqrt(( %11.4g * %11.4g) / ( %11.4g * %11.4g)) = sqrt(%11.4g / %11.4g) = %11.4g\n"
                ,dVar26,dVar22,dVar23,dVar24,dVar26 * dVar22,local_f0,dVar20);
    highsLogDev(pHVar17,kInfo,
                "Scaling: Yields [min, max, ratio] matrix values of [%0.4g, %0.4g, %0.4g]; Originally [%0.4g, %0.4g, %0.4g]: Improvement of %0.4g\n"
                ,local_f8,local_108,local_110,dVar30,dVar27,dVar27 / dVar30,dVar33);
    highsLogDev(pHVar17,kInfo,"Scaling: Improves    mean equilibration by a factor %0.4g\n",dVar20);
    highsLogDev(pHVar17,kInfo,"Scaling: Improves extreme equilibration by a factor %0.4g\n",dVar19);
    highsLogDev(pHVar17,kInfo,"Scaling: Improves max/min matrix values by a factor %0.4g\n",dVar33);
  }
  bVar18 = local_b4 == 3;
  dVar27 = dVar19 * dVar20 * dVar33;
  if (1.0 <= dVar27 || bVar18) {
    if ((options->super_HighsOptionsStruct).log_dev_level == 0) goto LAB_0025eab8;
    pHVar17 = &(options->super_HighsOptionsStruct).log_options;
    highsLogDev(pHVar17,kInfo,
                "Scaling: Factors are in [%0.4g, %0.4g] for columns and in [%0.4g, %0.4g] for rows\n"
                ,local_d8,local_d0,local_e8,local_e0);
    highsLogDev(pHVar17,kInfo,"Scaling: Improvement factor is %0.4g >= %0.4g so scale LP\n",dVar27,
                0x3ff0000000000000);
    if (dVar19 < 1.0) {
      highsLogDev(pHVar17,kWarning,"Scaling: Applying scaling with extreme improvement of %0.4g\n",
                  dVar19);
    }
    if (dVar20 < 1.0) {
      highsLogDev(pHVar17,kWarning,"Scaling: Applying scaling with mean improvement of %0.4g\n",
                  dVar20);
    }
    if (dVar33 < 1.0) {
      highsLogDev(pHVar17,kWarning,
                  "Scaling: Applying scaling with matrix value ratio improvement of %0.4g\n",dVar33)
      ;
    }
    if (10.0 <= dVar27) goto LAB_0025eab8;
    format = "Scaling: Applying scaling with improvement factor %0.4g < 10*(%0.4g) improvement\n";
    type = kWarning;
  }
  else {
    type = kInfo;
    piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0;
    while (uVar15 = uVar12, uVar15 != uVar11) {
      iVar16 = piVar6[uVar15 + 1];
      piVar8 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (lVar13 = (long)piVar6[uVar15]; uVar12 = uVar15 + 1, lVar13 < iVar16; lVar13 = lVar13 + 1)
      {
        pdVar7[lVar13] = pdVar7[lVar13] / (pdVar9[uVar15] * pdVar10[piVar8[lVar13]]);
      }
    }
    if ((options->super_HighsOptionsStruct).log_dev_level == 0) goto LAB_0025eab8;
    format = "Scaling: Improvement factor %0.4g < %0.4g required, so no scaling applied\n";
  }
  highsLogDev(&(options->super_HighsOptionsStruct).log_options,type,format,dVar27,0x3ff0000000000000
             );
LAB_0025eab8:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&original_row_max_value.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&original_row_min_value.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&row_max_value.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&row_min_value.super__Vector_base<double,_std::allocator<double>_>);
  return 1.0 <= dVar27 || bVar18;
}

Assistant:

bool equilibrationScaleMatrix(const HighsOptions& options, HighsLp& lp,
                              const HighsInt use_scale_strategy) {
  HighsInt numCol = lp.num_col_;
  HighsInt numRow = lp.num_row_;
  HighsScale& scale = lp.scale_;
  vector<double>& colScale = scale.col;
  vector<double>& rowScale = scale.row;
  vector<HighsInt>& Astart = lp.a_matrix_.start_;
  vector<HighsInt>& Aindex = lp.a_matrix_.index_;
  vector<double>& Avalue = lp.a_matrix_.value_;
  vector<double>& colCost = lp.col_cost_;

  HighsInt simplex_scale_strategy = use_scale_strategy;

  double original_matrix_min_value = kHighsInf;
  double original_matrix_max_value = 0;
  for (HighsInt k = 0, AnX = Astart[numCol]; k < AnX; k++) {
    double value = fabs(Avalue[k]);
    original_matrix_min_value = min(original_matrix_min_value, value);
    original_matrix_max_value = max(original_matrix_max_value, value);
  }

  // Include cost in scaling if minimum nonzero cost is less than 0.1
  double min_nonzero_cost = kHighsInf;
  for (HighsInt i = 0; i < numCol; i++) {
    if (colCost[i]) min_nonzero_cost = min(fabs(colCost[i]), min_nonzero_cost);
  }
  bool include_cost_in_scaling = false;
  include_cost_in_scaling = min_nonzero_cost < 0.1;

  // Limits on scaling factors
  double max_allow_scale;
  double min_allow_scale;
  // Now that kHighsInf =
  // std::numeric_limits<double>::infinity(), this Qi-trick doesn't
  // work so, in recognition, use the old value of kHighsInf
  const double finite_infinity = 1e200;
  max_allow_scale = pow(2.0, options.allowed_matrix_scale_factor);
  min_allow_scale = 1 / max_allow_scale;

  double min_allow_col_scale = min_allow_scale;
  double max_allow_col_scale = max_allow_scale;
  double min_allow_row_scale = min_allow_scale;
  double max_allow_row_scale = max_allow_scale;

  // Search up to 6 times
  vector<double> row_min_value(numRow, finite_infinity);
  vector<double> row_max_value(numRow, 1 / finite_infinity);
  for (HighsInt search_count = 0; search_count < 6; search_count++) {
    // Find column scale, prepare row data
    for (HighsInt iCol = 0; iCol < numCol; iCol++) {
      // For column scale (find)
      double col_min_value = finite_infinity;
      double col_max_value = 1 / finite_infinity;
      double abs_col_cost = fabs(colCost[iCol]);
      if (include_cost_in_scaling && abs_col_cost != 0) {
        col_min_value = min(col_min_value, abs_col_cost);
        col_max_value = max(col_max_value, abs_col_cost);
      }
      for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
        double value = fabs(Avalue[k]) * rowScale[Aindex[k]];
        col_min_value = min(col_min_value, value);
        col_max_value = max(col_max_value, value);
      }
      double col_equilibration = 1 / sqrt(col_min_value * col_max_value);
      // Ensure that column scale factor is not excessively large or small
      colScale[iCol] =
          min(max(min_allow_col_scale, col_equilibration), max_allow_col_scale);
      // For row scale (only collect)
      for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
        HighsInt iRow = Aindex[k];
        double value = fabs(Avalue[k]) * colScale[iCol];
        row_min_value[iRow] = min(row_min_value[iRow], value);
        row_max_value[iRow] = max(row_max_value[iRow], value);
      }
    }
    // For row scale (find)
    for (HighsInt iRow = 0; iRow < numRow; iRow++) {
      double row_equilibration =
          1 / sqrt(row_min_value[iRow] * row_max_value[iRow]);
      // Ensure that row scale factor is not excessively large or small
      rowScale[iRow] =
          min(max(min_allow_row_scale, row_equilibration), max_allow_row_scale);
    }
    row_min_value.assign(numRow, finite_infinity);
    row_max_value.assign(numRow, 1 / finite_infinity);
  }
  // Make it numerically better
  // Also determine the max and min row and column scaling factors
  double min_col_scale = finite_infinity;
  double max_col_scale = 1 / finite_infinity;
  double min_row_scale = finite_infinity;
  double max_row_scale = 1 / finite_infinity;
  const double log2 = log(2.0);
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    colScale[iCol] = pow(2.0, floor(log(colScale[iCol]) / log2 + 0.5));
    min_col_scale = min(colScale[iCol], min_col_scale);
    max_col_scale = max(colScale[iCol], max_col_scale);
  }
  for (HighsInt iRow = 0; iRow < numRow; iRow++) {
    rowScale[iRow] = pow(2.0, floor(log(rowScale[iRow]) / log2 + 0.5));
    min_row_scale = min(rowScale[iRow], min_row_scale);
    max_row_scale = max(rowScale[iRow], max_row_scale);
  }
  // Apply scaling to matrix and bounds
  double matrix_min_value = finite_infinity;
  double matrix_max_value = 0;
  double min_original_col_equilibration = finite_infinity;
  double sum_original_log_col_equilibration = 0;
  double max_original_col_equilibration = 0;
  double min_original_row_equilibration = finite_infinity;
  double sum_original_log_row_equilibration = 0;
  double max_original_row_equilibration = 0;
  double min_col_equilibration = finite_infinity;
  double sum_log_col_equilibration = 0;
  double max_col_equilibration = 0;
  double min_row_equilibration = finite_infinity;
  double sum_log_row_equilibration = 0;
  double max_row_equilibration = 0;
  vector<double> original_row_min_value(numRow, finite_infinity);
  vector<double> original_row_max_value(numRow, 1 / finite_infinity);
  row_min_value.assign(numRow, finite_infinity);
  row_max_value.assign(numRow, 1 / finite_infinity);
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    double original_col_min_value = finite_infinity;
    double original_col_max_value = 1 / finite_infinity;
    double col_min_value = finite_infinity;
    double col_max_value = 1 / finite_infinity;
    for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      HighsInt iRow = Aindex[k];
      const double original_value = fabs(Avalue[k]);
      original_col_min_value = min(original_value, original_col_min_value);
      original_col_max_value = max(original_value, original_col_max_value);
      original_row_min_value[iRow] =
          min(original_row_min_value[iRow], original_value);
      original_row_max_value[iRow] =
          max(original_row_max_value[iRow], original_value);
      Avalue[k] *= (colScale[iCol] * rowScale[iRow]);
      const double value = fabs(Avalue[k]);
      col_min_value = min(value, col_min_value);
      col_max_value = max(value, col_max_value);
      row_min_value[iRow] = min(row_min_value[iRow], value);
      row_max_value[iRow] = max(row_max_value[iRow], value);
    }
    matrix_min_value = min(matrix_min_value, col_min_value);
    matrix_max_value = max(matrix_max_value, col_max_value);

    const double original_col_equilibration =
        1 / sqrt(original_col_min_value * original_col_max_value);
    min_original_col_equilibration =
        min(original_col_equilibration, min_original_col_equilibration);
    sum_original_log_col_equilibration += log(original_col_equilibration);
    max_original_col_equilibration =
        max(original_col_equilibration, max_original_col_equilibration);
    const double col_equilibration = 1 / sqrt(col_min_value * col_max_value);
    min_col_equilibration = min(col_equilibration, min_col_equilibration);
    sum_log_col_equilibration += log(col_equilibration);
    max_col_equilibration = max(col_equilibration, max_col_equilibration);
  }

  for (HighsInt iRow = 0; iRow < numRow; iRow++) {
    const double original_row_equilibration =
        1 / sqrt(original_row_min_value[iRow] * original_row_max_value[iRow]);
    min_original_row_equilibration =
        min(original_row_equilibration, min_original_row_equilibration);
    sum_original_log_row_equilibration += log(original_row_equilibration);
    max_original_row_equilibration =
        max(original_row_equilibration, max_original_row_equilibration);
    const double row_equilibration =
        1 / sqrt(row_min_value[iRow] * row_max_value[iRow]);
    min_row_equilibration = min(row_equilibration, min_row_equilibration);
    sum_log_row_equilibration += log(row_equilibration);
    max_row_equilibration = max(row_equilibration, max_row_equilibration);
  }
  const double geomean_original_col_equilibration =
      exp(sum_original_log_col_equilibration / numCol);
  const double geomean_original_row_equilibration =
      exp(sum_original_log_row_equilibration / numRow);
  const double geomean_col_equilibration =
      exp(sum_log_col_equilibration / numCol);
  const double geomean_row_equilibration =
      exp(sum_log_row_equilibration / numRow);
  if (options.log_dev_level) {
    highsLogDev(
        options.log_options, HighsLogType::kInfo,
        "Scaling: Original equilibration: min/mean/max %11.4g/%11.4g/%11.4g "
        "(cols); min/mean/max %11.4g/%11.4g/%11.4g (rows)\n",
        min_original_col_equilibration, geomean_original_col_equilibration,
        max_original_col_equilibration, min_original_row_equilibration,
        geomean_original_row_equilibration, max_original_row_equilibration);
    highsLogDev(
        options.log_options, HighsLogType::kInfo,
        "Scaling: Final    equilibration: min/mean/max %11.4g/%11.4g/%11.4g "
        "(cols); min/mean/max %11.4g/%11.4g/%11.4g (rows)\n",
        min_col_equilibration, geomean_col_equilibration, max_col_equilibration,
        min_row_equilibration, geomean_row_equilibration,
        max_row_equilibration);
  }

  // Compute the mean equilibration improvement
  const double geomean_original_col =
      max(geomean_original_col_equilibration,
          1 / geomean_original_col_equilibration);
  const double geomean_original_row =
      max(geomean_original_row_equilibration,
          1 / geomean_original_row_equilibration);
  const double geomean_col =
      max(geomean_col_equilibration, 1 / geomean_col_equilibration);
  const double geomean_row =
      max(geomean_row_equilibration, 1 / geomean_row_equilibration);
  const double mean_equilibration_improvement =
      sqrt((geomean_original_col * geomean_original_row) /
           (geomean_col * geomean_row));
  // Compute the extreme equilibration improvement
  const double original_col_ratio =
      max_original_col_equilibration / min_original_col_equilibration;
  const double original_row_ratio =
      max_original_row_equilibration / min_original_row_equilibration;
  const double col_ratio = max_col_equilibration / min_col_equilibration;
  const double row_ratio = max_row_equilibration / min_row_equilibration;
  const double extreme_equilibration_improvement =
      (original_col_ratio + original_row_ratio) / (col_ratio + row_ratio);
  // Compute the max/min matrix value improvement
  const double matrix_value_ratio = matrix_max_value / matrix_min_value;
  const double original_matrix_value_ratio =
      original_matrix_max_value / original_matrix_min_value;
  const double matrix_value_ratio_improvement =
      original_matrix_value_ratio / matrix_value_ratio;
  if (options.log_dev_level) {
    highsLogDev(
        options.log_options, HighsLogType::kInfo,
        "Scaling: Extreme equilibration improvement =      ( %11.4g + "
        "%11.4g) / ( %11.4g + %11.4g)  =      %11.4g / %11.4g  = %11.4g\n",
        original_col_ratio, original_row_ratio, col_ratio, row_ratio,
        (original_col_ratio + original_row_ratio), (col_ratio + row_ratio),
        extreme_equilibration_improvement);
    highsLogDev(
        options.log_options, HighsLogType::kInfo,
        "Scaling: Mean    equilibration improvement = sqrt(( %11.4g * "
        "%11.4g) / ( %11.4g * %11.4g)) = sqrt(%11.4g / %11.4g) = %11.4g\n",
        geomean_original_col, geomean_original_row, geomean_col, geomean_row,
        (geomean_original_col * geomean_original_row),
        (geomean_col * geomean_row), mean_equilibration_improvement);
    highsLogDev(
        options.log_options, HighsLogType::kInfo,
        "Scaling: Yields [min, max, ratio] matrix values of [%0.4g, %0.4g, "
        "%0.4g]; Originally [%0.4g, %0.4g, %0.4g]: Improvement of %0.4g\n",
        matrix_min_value, matrix_max_value, matrix_value_ratio,
        original_matrix_min_value, original_matrix_max_value,
        original_matrix_value_ratio, matrix_value_ratio_improvement);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "Scaling: Improves    mean equilibration by a factor %0.4g\n",
                mean_equilibration_improvement);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "Scaling: Improves extreme equilibration by a factor %0.4g\n",
                extreme_equilibration_improvement);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "Scaling: Improves max/min matrix values by a factor %0.4g\n",
                matrix_value_ratio_improvement);
  }
  const bool possibly_abandon_scaling =
      simplex_scale_strategy != kSimplexScaleStrategyForcedEquilibration;
  const double improvement_factor = extreme_equilibration_improvement *
                                    mean_equilibration_improvement *
                                    matrix_value_ratio_improvement;

  const double improvement_factor_required = 1.0;
  const bool poor_improvement =
      improvement_factor < improvement_factor_required;

  // Possibly abandon scaling if it's not improved equilibration significantly
  if (possibly_abandon_scaling && poor_improvement) {
    // Unscale the matrix
    for (HighsInt iCol = 0; iCol < numCol; iCol++) {
      for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
        HighsInt iRow = Aindex[k];
        Avalue[k] /= (colScale[iCol] * rowScale[iRow]);
      }
    }
    if (options.log_dev_level)
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Improvement factor %0.4g < %0.4g required, so no "
                  "scaling applied\n",
                  improvement_factor, improvement_factor_required);
    return false;
  } else {
    if (options.log_dev_level) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Factors are in [%0.4g, %0.4g] for columns and in "
                  "[%0.4g, %0.4g] for rows\n",
                  min_col_scale, max_col_scale, min_row_scale, max_row_scale);
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Improvement factor is %0.4g >= %0.4g so scale LP\n",
                  improvement_factor, improvement_factor_required);
      if (extreme_equilibration_improvement < 1.0) {
        highsLogDev(
            options.log_options, HighsLogType::kWarning,
            "Scaling: Applying scaling with extreme improvement of %0.4g\n",
            extreme_equilibration_improvement);
      }
      if (mean_equilibration_improvement < 1.0) {
        highsLogDev(
            options.log_options, HighsLogType::kWarning,
            "Scaling: Applying scaling with mean improvement of %0.4g\n",
            mean_equilibration_improvement);
      }
      if (matrix_value_ratio_improvement < 1.0) {
        highsLogDev(options.log_options, HighsLogType::kWarning,
                    "Scaling: Applying scaling with matrix value ratio "
                    "improvement of %0.4g\n",
                    matrix_value_ratio_improvement);
      }
      if (improvement_factor < 10 * improvement_factor_required) {
        highsLogDev(options.log_options, HighsLogType::kWarning,
                    "Scaling: Applying scaling with improvement factor %0.4g "
                    "< 10*(%0.4g) improvement\n",
                    improvement_factor, improvement_factor_required);
      }
    }
  }
  return true;
}